

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib530.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  FILE *__stream;
  timeval tVar10;
  int running;
  CURL *curl [4];
  fd_set exc;
  fd_set wr;
  fd_set rd;
  char target_url [256];
  int local_2f0;
  int local_2ec;
  timeval local_2e8;
  long local_2d8 [4];
  fd_set local_2b8;
  fd_set local_238;
  fd_set local_1b8;
  char local_138 [255];
  undefined1 local_39;
  
  local_2d8[0] = 0;
  local_2d8[1] = 0;
  local_2d8[2] = 0;
  local_2d8[3] = 0;
  tv_test_start = tutil_tvnow();
  iVar1 = curl_global_init(3);
  if (iVar1 != 0) {
    test_cold_1();
    goto LAB_001028ff;
  }
  lVar3 = curl_multi_init();
  if (lVar3 == 0) {
    test_cold_11();
    iVar1 = 0x7b;
  }
  else {
    lVar7 = 0;
    do {
      if (lVar7 == 4) {
        uVar2 = curl_multi_setopt(lVar3,3,1);
        __stream = _stderr;
        if (uVar2 != 0) {
          uVar8 = (ulong)uVar2;
          uVar5 = curl_multi_strerror(uVar2);
          pcVar9 = "%s:%d curl_multi_setopt() failed, with code %d (%s)\n";
          uVar6 = 0x42;
          goto LAB_001028ba;
        }
        fwrite("Start at URL 0\n",0xf,1,_stderr);
        local_2f0 = -99;
        local_2e8.tv_sec = 1;
        local_2e8.tv_usec = 0;
        uVar2 = curl_multi_perform(lVar3,&local_2ec);
        if (uVar2 != 0) goto LAB_00102915;
        goto LAB_001026c2;
      }
      lVar4 = curl_easy_init();
      local_2d8[lVar7] = lVar4;
      if (lVar4 == 0) {
        test_cold_6();
        iVar1 = 0x7c;
        goto LAB_001028cf;
      }
      sprintf(local_138,"%s%04i",URL,(ulong)((int)lVar7 + 1));
      local_39 = 0;
      iVar1 = curl_easy_setopt(lVar4,0x2712,local_138);
      if (iVar1 != 0) {
        test_cold_2();
        goto LAB_001028cf;
      }
      iVar1 = curl_easy_setopt(lVar4,0x29,1);
      if (iVar1 != 0) {
        test_cold_3();
        goto LAB_001028cf;
      }
      iVar1 = curl_easy_setopt(lVar4,0x2a,1);
      if (iVar1 != 0) {
        test_cold_4();
        goto LAB_001028cf;
      }
      iVar1 = curl_multi_add_handle(lVar3,lVar4);
      lVar7 = lVar7 + 1;
    } while (iVar1 == 0);
    test_cold_5();
  }
  goto LAB_001028cf;
  while( true ) {
    if (local_2ec == 0) {
      iVar1 = 0;
      goto LAB_001028cf;
    }
    local_1b8.__fds_bits[0xe] = 0;
    local_1b8.__fds_bits[0xf] = 0;
    local_1b8.__fds_bits[0xc] = 0;
    local_1b8.__fds_bits[0xd] = 0;
    local_1b8.__fds_bits[10] = 0;
    local_1b8.__fds_bits[0xb] = 0;
    local_1b8.__fds_bits[8] = 0;
    local_1b8.__fds_bits[9] = 0;
    local_1b8.__fds_bits[6] = 0;
    local_1b8.__fds_bits[7] = 0;
    local_1b8.__fds_bits[4] = 0;
    local_1b8.__fds_bits[5] = 0;
    local_1b8.__fds_bits[2] = 0;
    local_1b8.__fds_bits[3] = 0;
    local_1b8.__fds_bits[0] = 0;
    local_1b8.__fds_bits[1] = 0;
    local_238.__fds_bits[0] = 0;
    local_238.__fds_bits[1] = 0;
    local_238.__fds_bits[2] = 0;
    local_238.__fds_bits[3] = 0;
    local_238.__fds_bits[4] = 0;
    local_238.__fds_bits[5] = 0;
    local_238.__fds_bits[6] = 0;
    local_238.__fds_bits[7] = 0;
    local_238.__fds_bits[8] = 0;
    local_238.__fds_bits[9] = 0;
    local_238.__fds_bits[10] = 0;
    local_238.__fds_bits[0xb] = 0;
    local_238.__fds_bits[0xc] = 0;
    local_238.__fds_bits[0xd] = 0;
    local_238.__fds_bits[0xe] = 0;
    local_238.__fds_bits[0xf] = 0;
    local_2b8.__fds_bits[0] = 0;
    local_2b8.__fds_bits[1] = 0;
    local_2b8.__fds_bits[2] = 0;
    local_2b8.__fds_bits[3] = 0;
    local_2b8.__fds_bits[4] = 0;
    local_2b8.__fds_bits[5] = 0;
    local_2b8.__fds_bits[6] = 0;
    local_2b8.__fds_bits[7] = 0;
    local_2b8.__fds_bits[8] = 0;
    local_2b8.__fds_bits[9] = 0;
    local_2b8.__fds_bits[10] = 0;
    local_2b8.__fds_bits[0xb] = 0;
    local_2b8.__fds_bits[0xc] = 0;
    local_2b8.__fds_bits[0xd] = 0;
    local_2b8.__fds_bits[0xe] = 0;
    local_2b8.__fds_bits[0xf] = 0;
    iVar1 = curl_multi_fdset(lVar3,&local_1b8,&local_238,&local_2b8,&local_2f0);
    if (iVar1 != 0) {
      test_cold_8();
      goto LAB_001028cf;
    }
    if (local_2f0 < -1) {
      pcVar9 = "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
      uVar5 = 0x59;
      goto LAB_00102988;
    }
    iVar1 = select_wrapper(local_2f0 + 1,&local_1b8,&local_238,&local_2b8,&local_2e8);
    if (iVar1 == -1) {
      test_cold_10();
      iVar1 = 0x79;
      goto LAB_001028cf;
    }
    tVar10 = tutil_tvnow();
    lVar7 = tutil_tvdiff(tVar10,tv_test_start);
    if (60000 < lVar7) {
      test_cold_9();
      goto LAB_001029ad;
    }
    local_2f0 = -99;
    local_2e8.tv_sec = 1;
    local_2e8.tv_usec = 0;
    uVar2 = curl_multi_perform(lVar3,&local_2ec);
    if (uVar2 != 0) break;
LAB_001026c2:
    if (local_2ec < 0) {
      pcVar9 = 
      "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n";
      uVar5 = 0x4e;
LAB_00102988:
      fprintf(_stderr,pcVar9,
              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib530.c"
              ,uVar5);
      iVar1 = 0x7a;
      goto LAB_001028cf;
    }
    tVar10 = tutil_tvnow();
    lVar7 = tutil_tvdiff(tVar10,tv_test_start);
    if (60000 < lVar7) {
      test_cold_7();
LAB_001029ad:
      iVar1 = 0x7d;
      goto LAB_001028cf;
    }
  }
LAB_00102915:
  __stream = _stderr;
  uVar8 = (ulong)uVar2;
  uVar5 = curl_multi_strerror(uVar8);
  pcVar9 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
  uVar6 = 0x4e;
LAB_001028ba:
  iVar1 = (int)uVar8;
  fprintf(__stream,pcVar9,
          "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib530.c"
          ,uVar6,uVar8,uVar5);
LAB_001028cf:
  lVar7 = 0;
  do {
    lVar4 = local_2d8[lVar7];
    curl_multi_remove_handle(lVar3,lVar4);
    curl_easy_cleanup(lVar4);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  curl_multi_cleanup(lVar3);
  curl_global_cleanup();
LAB_001028ff:
  return iVar1;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURL *curl[NUM_HANDLES];
  int running;
  CURLM *m = NULL;
  int i;
  char target_url[256];

  for(i=0; i < NUM_HANDLES; i++)
    curl[i] = NULL;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  multi_init(m);

  /* get NUM_HANDLES easy handles */
  for(i=0; i < NUM_HANDLES; i++) {
    /* get an easy handle */
    easy_init(curl[i]);
    /* specify target */
    sprintf(target_url, "%s%04i", URL, i + 1);
    target_url[sizeof(target_url) - 1] = '\0';
    easy_setopt(curl[i], CURLOPT_URL, target_url);
    /* go verbose */
    easy_setopt(curl[i], CURLOPT_VERBOSE, 1L);
    /* include headers */
    easy_setopt(curl[i], CURLOPT_HEADER, 1L);
    /* add handle to multi */
    multi_add_handle(m, curl[i]);
  }

  multi_setopt(m, CURLMOPT_PIPELINING, 1L);

  fprintf(stderr, "Start at URL 0\n");

  for(;;) {
    struct timeval interval;
    fd_set rd, wr, exc;
    int maxfd = -99;

    interval.tv_sec = 1;
    interval.tv_usec = 0;

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running)
      break; /* done */

    FD_ZERO(&rd);
    FD_ZERO(&wr);
    FD_ZERO(&exc);

    multi_fdset(m, &rd, &wr, &exc, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd+1, &rd, &wr, &exc, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  /* proper cleanup sequence - type PB */

  for(i=0; i < NUM_HANDLES; i++) {
    curl_multi_remove_handle(m, curl[i]);
    curl_easy_cleanup(curl[i]);
  }

  curl_multi_cleanup(m);
  curl_global_cleanup();

  return res;
}